

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_comparison_suite.cpp
# Opt level: O0

void equality_suite::compare_wstring_equal_string(void)

{
  undefined1 local_e09;
  basic_variable<std::allocator<char>_> local_e08;
  basic_variable<std::allocator<char>_> local_dd8;
  undefined1 local_d9b [2];
  undefined1 local_d99;
  basic_variable<std::allocator<char>_> local_d98;
  basic_variable<std::allocator<char>_> local_d68;
  undefined1 local_d2b [2];
  undefined1 local_d29;
  basic_variable<std::allocator<char>_> local_d28;
  basic_variable<std::allocator<char>_> local_cf8;
  undefined1 local_cbb [2];
  undefined1 local_cb9;
  basic_variable<std::allocator<char>_> local_cb8;
  basic_variable<std::allocator<char>_> local_c88;
  undefined1 local_c4b [2];
  undefined1 local_c49;
  basic_variable<std::allocator<char>_> local_c48;
  basic_variable<std::allocator<char>_> local_c18;
  undefined1 local_bdb [2];
  undefined1 local_bd9;
  basic_variable<std::allocator<char>_> local_bd8;
  basic_variable<std::allocator<char>_> local_ba8;
  undefined1 local_b6b [2];
  undefined1 local_b69;
  basic_variable<std::allocator<char>_> local_b68;
  basic_variable<std::allocator<char>_> local_b38;
  undefined1 local_afb [2];
  undefined1 local_af9;
  basic_variable<std::allocator<char>_> local_af8;
  basic_variable<std::allocator<char>_> local_ac8;
  undefined1 local_a8b [2];
  undefined1 local_a89;
  basic_variable<std::allocator<char>_> local_a88;
  basic_variable<std::allocator<char>_> local_a58;
  undefined1 local_a1b [2];
  undefined1 local_a19;
  basic_variable<std::allocator<char>_> local_a18;
  basic_variable<std::allocator<char>_> local_9e8;
  undefined1 local_9ab [2];
  undefined1 local_9a9;
  basic_variable<std::allocator<char>_> local_9a8;
  basic_variable<std::allocator<char>_> local_978;
  undefined1 local_93b [2];
  undefined1 local_939;
  basic_variable<std::allocator<char>_> local_938;
  basic_variable<std::allocator<char>_> local_908;
  undefined1 local_8cb [2];
  undefined1 local_8c9;
  basic_variable<std::allocator<char>_> local_8c8;
  basic_variable<std::allocator<char>_> local_898;
  undefined1 local_85b [2];
  undefined1 local_859;
  basic_variable<std::allocator<char>_> local_858;
  basic_variable<std::allocator<char>_> local_828;
  undefined1 local_7eb [2];
  undefined1 local_7e9;
  basic_variable<std::allocator<char>_> local_7e8;
  basic_variable<std::allocator<char>_> local_7b8;
  undefined1 local_77b [2];
  undefined1 local_779;
  basic_variable<std::allocator<char>_> local_778;
  basic_variable<std::allocator<char>_> local_748;
  undefined1 local_70b [2];
  undefined1 local_709;
  basic_variable<std::allocator<char>_> local_708;
  basic_variable<std::allocator<char>_> local_6d8;
  undefined1 local_69b [2];
  undefined1 local_699;
  basic_variable<std::allocator<char>_> local_698;
  basic_variable<std::allocator<char>_> local_668;
  undefined1 local_62b [2];
  undefined1 local_629;
  basic_variable<std::allocator<char>_> local_628;
  basic_variable<std::allocator<char>_> local_5f8;
  undefined1 local_5bb [2];
  undefined1 local_5b9;
  basic_variable<std::allocator<char>_> local_5b8;
  basic_variable<std::allocator<char>_> local_588;
  undefined1 local_54b [2];
  undefined1 local_549;
  basic_variable<std::allocator<char>_> local_548;
  basic_variable<std::allocator<char>_> local_518;
  undefined1 local_4db [2];
  undefined1 local_4d9;
  basic_variable<std::allocator<char>_> local_4d8;
  basic_variable<std::allocator<char>_> local_4a8;
  undefined1 local_46b [2];
  undefined1 local_469;
  basic_variable<std::allocator<char>_> local_468;
  basic_variable<std::allocator<char>_> local_438;
  undefined1 local_3fb [2];
  undefined1 local_3f9;
  basic_variable<std::allocator<char>_> local_3f8;
  basic_variable<std::allocator<char>_> local_3c8;
  undefined1 local_38b [2];
  undefined1 local_389;
  basic_variable<std::allocator<char>_> local_388;
  basic_variable<std::allocator<char>_> local_358;
  undefined1 local_31b [2];
  undefined1 local_319;
  basic_variable<std::allocator<char>_> local_318;
  basic_variable<std::allocator<char>_> local_2e8;
  undefined1 local_2ab [2];
  undefined1 local_2a9;
  basic_variable<std::allocator<char>_> local_2a8;
  basic_variable<std::allocator<char>_> local_278;
  undefined1 local_23b [2];
  undefined1 local_239;
  basic_variable<std::allocator<char>_> local_238;
  basic_variable<std::allocator<char>_> local_208;
  undefined1 local_1cb [2];
  undefined1 local_1c9;
  basic_variable<std::allocator<char>_> local_1c8;
  basic_variable<std::allocator<char>_> local_198;
  undefined1 local_15b [2];
  undefined1 local_159;
  basic_variable<std::allocator<char>_> local_158;
  basic_variable<std::allocator<char>_> local_128;
  undefined1 local_eb [2];
  undefined1 local_e9;
  basic_variable<std::allocator<char>_> local_e8;
  basic_variable<std::allocator<char>_> local_b8;
  undefined1 local_87 [2];
  undefined1 local_85 [13];
  basic_variable<std::allocator<char>_> local_78;
  basic_variable<std::allocator<char>_> local_48;
  undefined1 local_a [2];
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_48,L"");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_78,"bravo");
  local_a[0] = trial::dynamic::operator==(&local_48,&local_78);
  local_85[0] = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"\") == variable(\"bravo\")","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x928,"void equality_suite::compare_wstring_equal_string()",local_a,local_85);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_78);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_48);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_b8,L"");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_e8,"bravo");
  local_87[0] = trial::dynamic::operator!=(&local_b8,&local_e8);
  local_e9 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"\") != variable(\"bravo\")","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x929,"void equality_suite::compare_wstring_equal_string()",local_87,&local_e9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_128,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_158,"");
  local_eb[0] = trial::dynamic::operator==(&local_128,&local_158);
  local_159 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") == variable(\"\")","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x92a,"void equality_suite::compare_wstring_equal_string()",local_eb,&local_159);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_158);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_128);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_198,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_1c8,"");
  local_15b[0] = trial::dynamic::operator!=(&local_198,&local_1c8);
  local_1c9 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") != variable(\"\")","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x92b,"void equality_suite::compare_wstring_equal_string()",local_15b,&local_1c9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_1c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_198);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_208,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_238,"bravo");
  local_1cb[0] = trial::dynamic::operator==(&local_208,&local_238);
  local_239 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") == variable(\"bravo\")","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x92d,"void equality_suite::compare_wstring_equal_string()",local_1cb,&local_239);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_238);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_208);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_278,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_2a8,"bravo");
  local_23b[0] = trial::dynamic::operator!=(&local_278,&local_2a8);
  local_2a9 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") != variable(\"bravo\")","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x92e,"void equality_suite::compare_wstring_equal_string()",local_23b,&local_2a9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_2a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_278);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_2e8,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_318,"zulu");
  local_2ab[0] = trial::dynamic::operator==(&local_2e8,&local_318);
  local_319 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") == variable(\"zulu\")","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x92f,"void equality_suite::compare_wstring_equal_string()",local_2ab,&local_319);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_318);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_2e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_358,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_388,"zulu");
  local_31b[0] = trial::dynamic::operator!=(&local_358,&local_388);
  local_389 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") != variable(\"zulu\")","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x930,"void equality_suite::compare_wstring_equal_string()",local_31b,&local_389);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_388);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_358);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_3c8,L"");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_3f8,L"bravo");
  local_38b[0] = trial::dynamic::operator==(&local_3c8,&local_3f8);
  local_3f9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"\") == variable(L\"bravo\")","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x934,"void equality_suite::compare_wstring_equal_string()",local_38b,&local_3f9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_3f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_3c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_438,L"");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_468,L"bravo");
  local_3fb[0] = trial::dynamic::operator!=(&local_438,&local_468);
  local_469 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"\") != variable(L\"bravo\")","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x935,"void equality_suite::compare_wstring_equal_string()",local_3fb,&local_469);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_468);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_438);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_4a8,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_4d8,L"");
  local_46b[0] = trial::dynamic::operator==(&local_4a8,&local_4d8);
  local_4d9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") == variable(L\"\")","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x936,"void equality_suite::compare_wstring_equal_string()",local_46b,&local_4d9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_4d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_4a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_518,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_548,L"");
  local_4db[0] = trial::dynamic::operator!=(&local_518,&local_548);
  local_549 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") != variable(L\"\")","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x937,"void equality_suite::compare_wstring_equal_string()",local_4db,&local_549);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_548);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_518);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_588,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_5b8,L"bravo");
  local_54b[0] = trial::dynamic::operator==(&local_588,&local_5b8);
  local_5b9 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") == variable(L\"bravo\")","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x939,"void equality_suite::compare_wstring_equal_string()",local_54b,&local_5b9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_5b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_588);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_5f8,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_628,L"bravo");
  local_5bb[0] = trial::dynamic::operator!=(&local_5f8,&local_628);
  local_629 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") != variable(L\"bravo\")","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x93a,"void equality_suite::compare_wstring_equal_string()",local_5bb,&local_629);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_628);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_5f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_668,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_698,L"zulu");
  local_62b[0] = trial::dynamic::operator==(&local_668,&local_698);
  local_699 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") == variable(L\"zulu\")","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x93b,"void equality_suite::compare_wstring_equal_string()",local_62b,&local_699);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_698);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_668);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_6d8,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_708,L"zulu");
  local_69b[0] = trial::dynamic::operator!=(&local_6d8,&local_708);
  local_709 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") != variable(L\"zulu\")","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x93c,"void equality_suite::compare_wstring_equal_string()",local_69b,&local_709);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_708);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_6d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_748,L"");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_778,L"bravo");
  local_70b[0] = trial::dynamic::operator==(&local_748,&local_778);
  local_779 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"\") == variable(u\"bravo\")","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x940,"void equality_suite::compare_wstring_equal_string()",local_70b,&local_779);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_778);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_748);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_7b8,L"");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_7e8,L"bravo");
  local_77b[0] = trial::dynamic::operator!=(&local_7b8,&local_7e8);
  local_7e9 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"\") != variable(u\"bravo\")","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x941,"void equality_suite::compare_wstring_equal_string()",local_77b,&local_7e9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_7e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_7b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_828,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_858,L"");
  local_7eb[0] = trial::dynamic::operator==(&local_828,&local_858);
  local_859 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") == variable(u\"\")","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x942,"void equality_suite::compare_wstring_equal_string()",local_7eb,&local_859);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_858);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_828);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_898,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_8c8,L"");
  local_85b[0] = trial::dynamic::operator!=(&local_898,&local_8c8);
  local_8c9 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") != variable(u\"\")","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x943,"void equality_suite::compare_wstring_equal_string()",local_85b,&local_8c9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_8c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_898);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_908,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_938,L"bravo");
  local_8cb[0] = trial::dynamic::operator==(&local_908,&local_938);
  local_939 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") == variable(u\"bravo\")","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x945,"void equality_suite::compare_wstring_equal_string()",local_8cb,&local_939);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_938);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_908);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_978,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_9a8,L"bravo");
  local_93b[0] = trial::dynamic::operator!=(&local_978,&local_9a8);
  local_9a9 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") != variable(u\"bravo\")","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x946,"void equality_suite::compare_wstring_equal_string()",local_93b,&local_9a9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_9a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_978);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_9e8,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_a18,L"zulu");
  local_9ab[0] = trial::dynamic::operator==(&local_9e8,&local_a18);
  local_a19 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") == variable(u\"zulu\")","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x947,"void equality_suite::compare_wstring_equal_string()",local_9ab,&local_a19);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_a18);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_9e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_a58,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_a88,L"zulu");
  local_a1b[0] = trial::dynamic::operator!=(&local_a58,&local_a88);
  local_a89 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") != variable(u\"zulu\")","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x948,"void equality_suite::compare_wstring_equal_string()",local_a1b,&local_a89);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_a88);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_a58);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_ac8,L"");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_af8,L"bravo");
  local_a8b[0] = trial::dynamic::operator==(&local_ac8,&local_af8);
  local_af9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"\") == variable(U\"bravo\")","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x94c,"void equality_suite::compare_wstring_equal_string()",local_a8b,&local_af9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_af8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_ac8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_b38,L"");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_b68,L"bravo");
  local_afb[0] = trial::dynamic::operator!=(&local_b38,&local_b68);
  local_b69 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"\") != variable(U\"bravo\")","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x94d,"void equality_suite::compare_wstring_equal_string()",local_afb,&local_b69);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_b68);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_b38);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_ba8,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_bd8,L"");
  local_b6b[0] = trial::dynamic::operator==(&local_ba8,&local_bd8);
  local_bd9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") == variable(U\"\")","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x94e,"void equality_suite::compare_wstring_equal_string()",local_b6b,&local_bd9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_bd8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_ba8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_c18,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_c48,L"");
  local_bdb[0] = trial::dynamic::operator!=(&local_c18,&local_c48);
  local_c49 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") != variable(U\"\")","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x94f,"void equality_suite::compare_wstring_equal_string()",local_bdb,&local_c49);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_c48);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_c18);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_c88,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_cb8,L"bravo");
  local_c4b[0] = trial::dynamic::operator==(&local_c88,&local_cb8);
  local_cb9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") == variable(U\"bravo\")","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x951,"void equality_suite::compare_wstring_equal_string()",local_c4b,&local_cb9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_cb8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_c88);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_cf8,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_d28,L"bravo");
  local_cbb[0] = trial::dynamic::operator!=(&local_cf8,&local_d28);
  local_d29 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") != variable(U\"bravo\")","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x952,"void equality_suite::compare_wstring_equal_string()",local_cbb,&local_d29);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_d28);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_cf8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_d68,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_d98,L"zulu");
  local_d2b[0] = trial::dynamic::operator==(&local_d68,&local_d98);
  local_d99 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") == variable(U\"zulu\")","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x953,"void equality_suite::compare_wstring_equal_string()",local_d2b,&local_d99);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_d98);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_d68);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_dd8,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_e08,L"zulu");
  local_d9b[0] = trial::dynamic::operator!=(&local_dd8,&local_e08);
  local_e09 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") != variable(U\"zulu\")","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x954,"void equality_suite::compare_wstring_equal_string()",local_d9b,&local_e09);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_e08);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_dd8);
  return;
}

Assistant:

void compare_wstring_equal_string()
{
    // wstring - string
    {
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"") == variable("bravo"), false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"") != variable("bravo"), true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") == variable(""), false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") != variable(""), true);

        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") == variable("bravo"), false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") != variable("bravo"), true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") == variable("zulu"), false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") != variable("zulu"), true);
    }
    // wstring - wstring
    {
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"") == variable(L"bravo"), false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"") != variable(L"bravo"), true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") == variable(L""), false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") != variable(L""), true);

        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") == variable(L"bravo"), true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") != variable(L"bravo"), false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") == variable(L"zulu"), false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") != variable(L"zulu"), true);
    }
    // wstring - u16string
    {
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"") == variable(u"bravo"), false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"") != variable(u"bravo"), true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") == variable(u""), false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") != variable(u""), true);

        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") == variable(u"bravo"), false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") != variable(u"bravo"), true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") == variable(u"zulu"), false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") != variable(u"zulu"), true);
    }
    // wstring - u32string
    {
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"") == variable(U"bravo"), false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"") != variable(U"bravo"), true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") == variable(U""), false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") != variable(U""), true);

        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") == variable(U"bravo"), false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") != variable(U"bravo"), true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") == variable(U"zulu"), false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") != variable(U"zulu"), true);
    }
}